

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall
capnp::Orphan<capnp::DynamicValue>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  char cVar2;
  uint16_t uVar3;
  size_t sVar4;
  RawBrandedSchema *pRVar5;
  uint64_t uVar6;
  char *pcVar7;
  SegmentBuilder *pSVar8;
  CapTableBuilder *pCVar9;
  StructPointerCount SVar10;
  undefined1 uVar11;
  ListElementCount LVar12;
  BitsPerElementN<23> BVar13;
  ElementSize EVar14;
  Which elementType;
  uint uVar15;
  int64_t iVar16;
  ushort uVar17;
  ListBuilder *__return_storage_ptr___00;
  ArrayPtr<unsigned_char> AVar18;
  Fault f;
  Schema local_f0;
  Reader local_e8;
  Builder local_b8;
  StructBuilder local_a0;
  ListBuilder local_78;
  ListBuilder local_50;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar16 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_003fa7c0;
  case UINT:
    iVar16 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_003fa7c0:
    (__return_storage_ptr__->field_1).intValue = iVar16;
    break;
  case FLOAT:
    iVar16 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar16;
    break;
  case TEXT:
    capnp::_::OrphanBuilder::asText(&local_b8,&this->builder);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_b8.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_b8._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_b8.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    AVar18 = (ArrayPtr<unsigned_char>)capnp::_::OrphanBuilder::asData(&this->builder);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar18;
    break;
  case LIST:
    cVar2 = *(char *)((long)&this->field_1 + 2);
    uVar6 = (this->field_1).uintValue;
    pcVar7 = *(char **)((long)&this->field_1 + 8);
    if ((cVar2 == '\0') && ((this->field_1).listSchema.elementType.baseType == STRUCT)) {
      local_f0.raw = (RawBrandedSchema *)Type::asStruct((Type *)&(this->field_1).enumValue);
      Schema::getProto(&local_e8,&local_f0);
      uVar15 = 0;
      if (local_e8._reader.dataSize < 0x80) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(ushort *)
                  ((long)&(((CapTableBuilder *)((long)local_e8._reader.data + 8))->
                          super_CapTableReader)._vptr_CapTableReader + 6);
        if (0xcf < local_e8._reader.dataSize) {
          uVar15 = (uint)*(ushort *)
                          &(((CapTableBuilder *)((long)local_e8._reader.data + 0x18))->
                           super_CapTableReader)._vptr_CapTableReader << 0x10;
        }
      }
      __return_storage_ptr___00 = &local_50;
      capnp::_::OrphanBuilder::asStructList
                (__return_storage_ptr___00,&this->builder,(StructSize)(uVar17 | uVar15));
    }
    else {
      elementType = LIST;
      if (cVar2 == '\0') {
        elementType = (Which)uVar6;
      }
      EVar14 = anon_unknown_71::elementSizeFor(elementType);
      __return_storage_ptr___00 = &local_78;
      capnp::_::OrphanBuilder::asList(__return_storage_ptr___00,&this->builder,EVar14);
    }
    SVar10 = __return_storage_ptr___00->structPointerCount;
    EVar14 = __return_storage_ptr___00->elementSize;
    uVar11 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar10;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar14;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar11;
    pSVar8 = __return_storage_ptr___00->segment;
    pCVar9 = __return_storage_ptr___00->capTable;
    LVar12 = __return_storage_ptr___00->elementCount;
    BVar13 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar12;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar13;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar8;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar9;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).uintValue = uVar6;
    (__return_storage_ptr__->field_1).textValue.content.ptr = pcVar7;
    break;
  case ENUM:
    iVar16 = (this->field_1).intValue;
    uVar3 = (this->field_1).enumValue.value;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar16;
    *(uint16_t *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    pRVar5 = (RawBrandedSchema *)(this->field_1).intValue;
    local_f0.raw = pRVar5;
    Schema::getProto(&local_e8,&local_f0);
    uVar15 = 0;
    if (local_e8._reader.dataSize < 0x80) {
      uVar17 = 0;
    }
    else {
      uVar17 = *(ushort *)
                ((long)&(((CapTableBuilder *)((long)local_e8._reader.data + 8))->
                        super_CapTableReader)._vptr_CapTableReader + 6);
      if (0xcf < local_e8._reader.dataSize) {
        uVar15 = (uint)*(ushort *)
                        &(((CapTableBuilder *)((long)local_e8._reader.data + 0x18))->
                         super_CapTableReader)._vptr_CapTableReader << 0x10;
      }
    }
    capnp::_::OrphanBuilder::asStruct(&local_a0,&this->builder,(StructSize)(uVar17 | uVar15));
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a0._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a0.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a0.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a0.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a0.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)pRVar5;
    break;
  case CAPABILITY:
    sVar4 = (this->field_1).intValue;
    capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_e8);
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).intValue = (int64_t)local_e8._reader.segment;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_e8._reader.capTable;
    (__return_storage_ptr__->field_1).textValue.content.size_ = sVar4;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x82b,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder Orphan<DynamicValue>::get() {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asText();
    case DynamicValue::DATA: return builder.asData();
    case DynamicValue::LIST:
      if (listSchema.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(listSchema,
            builder.asStructList(structSizeFromSchema(listSchema.getStructElementType())));
      } else {
        return DynamicList::Builder(listSchema,
            builder.asList(elementSizeFor(listSchema.whichElementType())));
      }
    case DynamicValue::STRUCT:
      return DynamicStruct::Builder(structSchema,
          builder.asStruct(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_REQUIRE("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                      "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}